

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_data.c
# Opt level: O1

int cmd_data_store(ly_ctx **ctx,yl_opt *yo,char *posv)

{
  int iVar1;
  cmdline_file *pcVar2;
  int iVar3;
  LYD_FORMAT format_data;
  ly_in *in;
  LYD_FORMAT local_24;
  ly_in *local_20;
  
  if (posv != (char *)0x0) {
    local_24 = yo->data_in_format;
    iVar1 = get_input(posv,(LYS_INFORMAT *)0x0,&local_24,&local_20);
    iVar3 = 1;
    if (iVar1 == 0) {
      pcVar2 = fill_cmdline_file(&yo->data_inputs,local_20,posv,local_24);
      iVar3 = 0;
      if (pcVar2 == (cmdline_file *)0x0) {
        iVar3 = 1;
        ly_in_free(local_20,1);
      }
    }
    return iVar3;
  }
  __assert_fail("posv",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/tools/lint/cmd_data.c"
                ,0x167,"int cmd_data_store(struct ly_ctx **, struct yl_opt *, const char *)");
}

Assistant:

int
cmd_data_store(struct ly_ctx **ctx, struct yl_opt *yo, const char *posv)
{
    (void) ctx;
    struct ly_in *in;
    LYD_FORMAT format_data;

    assert(posv);

    format_data = yo->data_in_format;

    /* process input data files provided as standalone command line arguments */
    if (get_input(posv, NULL, &format_data, &in)) {
        return 1;
    }

    if (!fill_cmdline_file(&yo->data_inputs, in, posv, format_data)) {
        ly_in_free(in, 1);
        return 1;
    }

    return 0;
}